

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ulong uVar3;
  ulong uVar5;
  ulong uVar6;
  ulong uVar4;
  
  uVar6 = (ulong)(this->Data).Size;
  pIVar1 = (this->Data).Data;
  pIVar2 = pIVar1;
  uVar4 = uVar6;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      uVar3 = uVar4 >> 1;
      uVar5 = uVar3;
      if (pIVar2[uVar3].key < key) {
        uVar5 = ~uVar3 + uVar4;
        pIVar2 = pIVar2 + uVar3 + 1;
      }
      uVar4 = uVar5;
    } while (uVar5 != 0);
  }
  if ((pIVar2 != pIVar1 + uVar6) && (pIVar2->key == key)) {
    default_val = (pIVar2->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImGuiStoragePair* it = LowerBound(const_cast<ImVector<ImGuiStoragePair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}